

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  CURLM *multi;
  long lVar3;
  char *__s;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  iVar2 = 0;
  if (iVar1 != 0) {
    test_cold_1();
    iVar2 = iVar1;
  }
  if (iVar2 != 0) goto LAB_001027dd;
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    test_cold_2();
    iVar2 = 0x7b;
    lVar3 = 0;
  }
  else {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      test_cold_3();
      iVar2 = 0x7c;
    }
    else {
      iVar1 = curl_multi_setopt(multi,3,1);
      iVar2 = 0;
      if (iVar1 != 0) {
        test_cold_4();
        iVar2 = iVar1;
      }
      if (iVar2 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x4e2b,fwrite);
        iVar2 = 0;
        if (iVar1 != 0) {
          test_cold_5();
          iVar2 = iVar1;
        }
        if (iVar2 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x2d,1);
          iVar2 = 0;
          if (iVar1 != 0) {
            test_cold_6();
            iVar2 = iVar1;
          }
          if (iVar2 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
            iVar2 = 0;
            if (iVar1 != 0) {
              test_cold_7();
              iVar2 = iVar1;
            }
            if (iVar2 == 0) {
              iVar1 = curl_multi_add_handle(multi,lVar3);
              iVar2 = 0;
              if (iVar1 != 0) {
                test_cold_8();
                iVar2 = iVar1;
              }
              if (iVar2 == 0) {
                iVar2 = perform(multi);
                if (iVar2 == 0) {
                  curl_multi_remove_handle(multi,lVar3);
                  curl_easy_reset(lVar3);
                  iVar1 = curl_easy_setopt(lVar3,0x2d,1);
                  iVar2 = 0;
                  if (iVar1 != 0) {
                    test_cold_9();
                    iVar2 = iVar1;
                  }
                  if (iVar2 == 0) {
                    iVar1 = curl_easy_setopt(lVar3,0x2712,libtest_arg2);
                    iVar2 = 0;
                    if (iVar1 != 0) {
                      test_cold_10();
                      iVar2 = iVar1;
                    }
                    if (iVar2 == 0) {
                      iVar1 = curl_multi_add_handle(multi,lVar3);
                      iVar2 = 0;
                      if (iVar1 != 0) {
                        test_cold_11();
                        iVar2 = iVar1;
                      }
                      if (iVar2 == 0) {
                        iVar2 = perform(multi);
                        if (iVar2 == 0) {
                          curl_multi_remove_handle(multi,lVar3);
                          iVar2 = 0;
                          goto LAB_001027bc;
                        }
                        __s = "retrieve 2 failed";
                      }
                      else {
                        __s = "curl_multi_add_handle() 2 failed";
                      }
                      goto LAB_00102862;
                    }
                  }
                  goto LAB_001027bc;
                }
                __s = "retrieve 1 failed";
              }
              else {
                __s = "curl_multi_add_handle() 1 failed";
              }
LAB_00102862:
              puts(__s);
            }
          }
        }
      }
    }
  }
LAB_001027bc:
  curl_easy_cleanup(lVar3);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  puts("Finished!");
LAB_001027dd:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}